

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_open.c
# Opt level: O1

mpt_libhandle * mpt_library_open(char *lib,char *lpath)

{
  char cVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  mpt_libhandle *pmVar6;
  undefined1 *unaff_RBP;
  size_t __n;
  char buf [1024];
  undefined1 local_438 [1032];
  
  if (lib == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    if ((lpath == (char *)0x0) || (*lib == '/')) {
      unaff_RBP = (undefined1 *)dlopen(lib,2);
      if (unaff_RBP == (undefined1 *)0x0) {
        piVar2 = __errno_location();
        *piVar2 = 2;
        return (mpt_libhandle *)0x0;
      }
    }
    else {
      do {
        if ((lpath == (char *)0x0) || (*lpath == '\0')) {
          piVar2 = __errno_location();
          *piVar2 = 2;
LAB_00101a90:
          cVar1 = '\x01';
        }
        else {
          pcVar3 = strchr(lpath,0x3a);
          if (pcVar3 == (char *)0x0) {
            __n = strlen(lpath);
            pcVar4 = (char *)0x0;
          }
          else {
            pcVar4 = pcVar3 + 1;
            __n = (long)pcVar3 - (long)lpath;
          }
          if (0x3ff < __n) {
LAB_00101a85:
            piVar2 = __errno_location();
            *piVar2 = 0x69;
            goto LAB_00101a90;
          }
          memcpy(local_438,lpath,__n);
          local_438[__n] = 0x2f;
          unaff_RBP = local_438 + __n + 1;
          sVar5 = strlen(lib);
          if (0x3ff - __n <= sVar5) goto LAB_00101a85;
          memcpy(unaff_RBP,lib,sVar5 + 1);
          unaff_RBP = (undefined1 *)dlopen(local_438,2);
          if (unaff_RBP != (undefined1 *)0x0) {
            pcVar4 = lpath;
          }
          cVar1 = (unaff_RBP != (undefined1 *)0x0) * '\x03';
          lpath = pcVar4;
        }
      } while (cVar1 == '\0');
      if (cVar1 != '\x03') {
        return (mpt_libhandle *)0x0;
      }
    }
    pmVar6 = (mpt_libhandle *)malloc(0x10);
    if (pmVar6 != (mpt_libhandle *)0x0) {
      (pmVar6->_ref)._val = 1;
      pmVar6->addr = unaff_RBP;
      return pmVar6;
    }
    dlclose(unaff_RBP);
    dlerror();
    piVar2 = __errno_location();
    *piVar2 = 0xc;
  }
  return (mpt_libhandle *)0x0;
}

Assistant:

extern MPT_STRUCT(libhandle) *mpt_library_open(const char *lib, const char *lpath)
{
	MPT_STRUCT(libhandle) *lh;
	void *newlib;
	
	if (!lib) {
		errno = EINVAL;
		return 0;
	}
	/* no resolution if path absolute */
	if (!lpath || *lib == '/') {
		if (!(newlib = dlopen(lib, RTLD_NOW))) {
			errno = ENOENT;
			return 0;
		}
	}
	else while (1) {
		const char *sep;
		char buf[1024];
		size_t left, len;
		
		if (!lpath || !*lpath) {
			errno = ENOENT;
			return 0;
		}
		if ((sep = strchr(lpath, ':'))) {
			len = sep++ - lpath;
		} else {
			len = strlen(lpath);
		}
		/* set library path */
		if (len >= sizeof(buf)) {
			errno = ENOBUFS;
			return 0;
		}
		left = sizeof(buf) - len;
		memcpy(buf, lpath, len);
		buf[len++] = '/';
		newlib = buf + len;
		
		/* buffer too small */
		if (--left <= (len = strlen(lib))) {
			errno = ENOBUFS;
			return 0;
		}
		memcpy(newlib, lib, len + 1);
		
		if ((newlib = dlopen(buf, RTLD_NOW))) {
			break;
		}
		lpath = sep;
	}
	if (!(lh = malloc(sizeof(*lh)))) {
		dlclose(newlib);
		dlerror();
		errno = ENOMEM;
		return 0;
	}
	lh->_ref._val = 1;
	lh->addr = newlib;
	
	return lh;
}